

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_current.c
# Opt level: O2

int set_current_field(FORM *form,FIELD *field)

{
  _Bool _Var1;
  short sVar2;
  int iVar3;
  int *piVar4;
  
  if (field == (FIELD *)0x0 || form == (FORM *)0x0) {
    iVar3 = -2;
  }
  else {
    iVar3 = -0xc;
    if ((field->form == form) && ((~field->opts & 3U) == 0)) {
      if ((form->status & 1) == 0) {
        form->current = field;
        form->curpage = field->page;
      }
      else {
        if ((form->status & 2) != 0) {
          iVar3 = -5;
          goto LAB_003f5310;
        }
        if (form->current != field) {
          _Var1 = _nc_Internal_Validation(form);
          if (_Var1) {
            if (form->fieldterm != (_func_void_formnode_ptr *)0x0) {
              *(byte *)&form->status = (byte)form->status | 2;
              (*form->fieldterm)(form);
              *(byte *)&form->status = (byte)form->status & 0xfd;
            }
            sVar2 = field->page;
            if (sVar2 == form->curpage) {
              iVar3 = _nc_Set_Current_Field(form,field);
            }
            else {
              if (form->formterm != (_func_void_formnode_ptr *)0x0) {
                *(byte *)&form->status = (byte)form->status | 2;
                (*form->formterm)(form);
                *(byte *)&form->status = (byte)form->status & 0xfd;
                sVar2 = field->page;
              }
              iVar3 = _nc_Set_Form_Page(form,(int)sVar2,field);
              if (form->forminit != (_func_void_formnode_ptr *)0x0) {
                *(byte *)&form->status = (byte)form->status | 2;
                (*form->forminit)(form);
                *(byte *)&form->status = (byte)form->status & 0xfd;
              }
            }
            if (form->fieldinit != (_func_void_formnode_ptr *)0x0) {
              *(byte *)&form->status = (byte)form->status | 2;
              (*form->fieldinit)(form);
              *(byte *)&form->status = (byte)form->status & 0xfd;
            }
            _nc_Refresh_Current_Field(form);
          }
          else {
            iVar3 = -0xd;
          }
          goto LAB_003f5310;
        }
      }
      iVar3 = 0;
    }
  }
LAB_003f5310:
  piVar4 = __errno_location();
  *piVar4 = iVar3;
  return iVar3;
}

Assistant:

int set_current_field(FORM  * form, FIELD * field)
{
  int err = E_OK;

  if ( !form || !field )
    RETURN(E_BAD_ARGUMENT);

  if ( (form != field->form) || Field_Is_Not_Selectable(field) )
    RETURN(E_REQUEST_DENIED);

  if (!(form->status & _POSTED))
    {
      form->current = field;
      form->curpage = field->page;
  }
  else
    {
      if (form->status & _IN_DRIVER) 
	err = E_BAD_STATE;
      else
	{
	  if (form->current != field)
	    {
	      if (!_nc_Internal_Validation(form)) 
	       err = E_INVALID_FIELD;
	      else
		{
		  Call_Hook(form,fieldterm);
		  if (field->page != form->curpage)
		    {
		      Call_Hook(form,formterm);
		      err = _nc_Set_Form_Page(form,field->page,field);
		      Call_Hook(form,forminit);
		    } 
		  else 
		    {
		      err = _nc_Set_Current_Field(form,field);
		    }
		  Call_Hook(form,fieldinit);
		  _nc_Refresh_Current_Field(form);
		}
	    }
	}
    }
  RETURN(err);
}